

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void setup_loop_pressure(gen_ctx_t gen_ctx,loop_node_t_conflict loop_node)

{
  loop_node_t_conflict local_20;
  loop_node_t_conflict curr;
  loop_node_t_conflict loop_node_local;
  gen_ctx_t gen_ctx_local;
  
  for (local_20 = DLIST_loop_node_t_head(&loop_node->children);
      local_20 != (loop_node_t_conflict)0x0; local_20 = DLIST_loop_node_t_next(local_20)) {
    if (local_20->bb == (bb_t)0x0) {
      setup_loop_pressure(gen_ctx,local_20);
    }
    else {
      local_20->max_int_pressure = local_20->bb->max_int_pressure;
      local_20->max_fp_pressure = local_20->bb->max_fp_pressure;
    }
    if (loop_node->max_int_pressure < local_20->max_int_pressure) {
      loop_node->max_int_pressure = local_20->max_int_pressure;
    }
    if (loop_node->max_fp_pressure < local_20->max_fp_pressure) {
      loop_node->max_fp_pressure = local_20->max_fp_pressure;
    }
  }
  return;
}

Assistant:

static void setup_loop_pressure (gen_ctx_t gen_ctx, loop_node_t loop_node) {
  for (loop_node_t curr = DLIST_HEAD (loop_node_t, loop_node->children); curr != NULL;
       curr = DLIST_NEXT (loop_node_t, curr)) {
    if (curr->bb == NULL) {
      setup_loop_pressure (gen_ctx, curr);
    } else {
      curr->max_int_pressure = curr->bb->max_int_pressure;
      curr->max_fp_pressure = curr->bb->max_fp_pressure;
    }
    if (loop_node->max_int_pressure < curr->max_int_pressure)
      loop_node->max_int_pressure = curr->max_int_pressure;
    if (loop_node->max_fp_pressure < curr->max_fp_pressure)
      loop_node->max_fp_pressure = curr->max_fp_pressure;
  }
}